

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  int iVar3;
  xmlDtdPtr pxVar4;
  xmlDtdPtr dtd;
  int res;
  size_t pos;
  int terminate_local;
  int size_local;
  char *chunk_local;
  htmlParserCtxtPtr ctxt_local;
  
  if ((((ctxt == (htmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) ||
      (ctxt->input->buf == (xmlParserInputBufferPtr)0x0)) ||
     ((size < 0 || ((0 < size && (chunk == (char *)0x0)))))) {
    ctxt_local._4_4_ = 0x73;
  }
  else if (ctxt->disableSAX < 2) {
    if (0 < size) {
      pxVar1 = ctxt->input->cur;
      pxVar2 = ctxt->input->base;
      iVar3 = xmlParserInputBufferPush(ctxt->input->buf,size,chunk);
      xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar1 - (long)pxVar2);
      if (iVar3 < 0) {
        htmlParseErr(ctxt,ctxt->input->buf->error,"xmlParserInputBufferPush failed",(xmlChar *)0x0,
                     (xmlChar *)0x0);
        xmlHaltParser(ctxt);
        return ctxt->errNo;
      }
    }
    htmlParseTryOrFinish(ctxt,terminate);
    if ((terminate != 0) && (ctxt->instate != XML_PARSER_EOF)) {
      htmlAutoCloseOnEnd(ctxt);
      xmlParserCheckEOF(ctxt,XML_ERR_INTERNAL_ERROR);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (ctxt->sax->endDocument != (endDocumentSAXFunc)0x0)) {
        (*ctxt->sax->endDocument)(ctxt->userData);
      }
      if ((((ctxt->options & 4U) == 0) && (ctxt->myDoc != (xmlDocPtr)0x0)) &&
         (pxVar4 = xmlGetIntSubset(ctxt->myDoc), pxVar4 == (xmlDtdPtr)0x0)) {
        pxVar4 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                    (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                    (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
        ctxt->myDoc->intSubset = pxVar4;
        if (ctxt->myDoc->intSubset == (_xmlDtd *)0x0) {
          htmlErrMemory(ctxt);
        }
      }
      ctxt->instate = XML_PARSER_EOF;
    }
    ctxt_local._4_4_ = ctxt->errNo;
  }
  else {
    ctxt_local._4_4_ = ctxt->errNo;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) ||
        (ctxt->input == NULL) || (ctxt->input->buf == NULL) ||
        (size < 0) ||
        ((size > 0) && (chunk == NULL)))
	return(XML_ERR_ARGUMENT);
    if (PARSER_STOPPED(ctxt) != 0)
        return(ctxt->errNo);

    if (size > 0)  {
	size_t pos = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
	if (res < 0) {
            htmlParseErr(ctxt, ctxt->input->buf->error,
                         "xmlParserInputBufferPush failed", NULL, NULL);
            xmlHaltParser(ctxt);
	    return (ctxt->errNo);
	}
    }

    htmlParseTryOrFinish(ctxt, terminate);

    if ((terminate) && (ctxt->instate != XML_PARSER_EOF)) {
        htmlAutoCloseOnEnd(ctxt);

        /*
         * Only check for truncated multi-byte sequences
         */
        xmlParserCheckEOF(ctxt, XML_ERR_INTERNAL_ERROR);

        if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
            ctxt->sax->endDocument(ctxt->userData);

        if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) &&
            (ctxt->myDoc != NULL)) {
            xmlDtdPtr dtd;
            dtd = xmlGetIntSubset(ctxt->myDoc);
            if (dtd == NULL) {
                ctxt->myDoc->intSubset =
                    xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
                        BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
                        BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
                if (ctxt->myDoc->intSubset == NULL)
                    htmlErrMemory(ctxt);
            }
        }

	ctxt->instate = XML_PARSER_EOF;
    }

    return((xmlParserErrors) ctxt->errNo);
}